

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode * cuddBddLICBuildResult(DdManager *dd,DdNode *f,st__table *cache,st__table *table)

{
  int iVar1;
  DdNode *local_90;
  DdNode *local_88;
  uint local_7c;
  uint local_78;
  int markings;
  int markE;
  int markT;
  int comple;
  int index;
  DdNode *zero;
  DdNode *one;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *Fnv;
  DdNode *Fv;
  st__table *table_local;
  st__table *cache_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  zero = dd->one;
  _comple = (DdNode *)((ulong)zero ^ 1);
  dd_local = (DdManager *)f;
  if (*(int *)((ulong)f & 0xfffffffffffffffe) != 0x7fffffff) {
    markE = (uint)f & 1;
    cache_local = (st__table *)((ulong)f & 0xfffffffffffffffe);
    Fv = (DdNode *)table;
    table_local = cache;
    f_local = &dd->sentinel;
    iVar1 = st__lookup(cache,(char *)cache_local,(char **)&t);
    if (iVar1 == 0) {
      iVar1 = st__lookup_int((st__table *)Fv,(char *)cache_local,(int *)&local_7c);
      if (iVar1 == 0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        markings = (int)local_7c >> 2;
        local_78 = local_7c & 3;
        markT = *(int *)&cache_local->compare;
        Fnv = *(DdNode **)&cache_local->num_bins;
        r = *(DdNode **)&cache_local->max_density;
        if (markings == 3) {
          e = cuddBddLICBuildResult((DdManager *)f_local,Fnv,table_local,(st__table *)Fv);
          if (e == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
        }
        else if (markings == 1) {
          e = zero;
        }
        else {
          e = _comple;
        }
        *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
        if (local_78 == 3) {
          one = cuddBddLICBuildResult((DdManager *)f_local,r,table_local,(st__table *)Fv);
          if (one == (DdNode *)0x0) {
            Cudd_IterDerefBdd((DdManager *)f_local,e);
            return (DdNode *)0x0;
          }
        }
        else if (local_78 == 1) {
          one = zero;
        }
        else {
          one = _comple;
        }
        *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + 1;
        if ((markings == 0) && (local_78 != 0)) {
          t = one;
        }
        else if ((markings == 0) || (local_78 != 0)) {
          if (((ulong)e & 1) == 0) {
            if (e == one) {
              local_90 = e;
            }
            else {
              local_90 = cuddUniqueInter((DdManager *)f_local,markT,e,one);
            }
            t = local_90;
            if (local_90 == (DdNode *)0x0) {
              Cudd_IterDerefBdd((DdManager *)f_local,one);
              Cudd_IterDerefBdd((DdManager *)f_local,e);
              return (DdNode *)0x0;
            }
          }
          else {
            local_88 = (DdNode *)((ulong)e ^ 1);
            one = (DdNode *)((ulong)one ^ 1);
            e = local_88;
            if (local_88 != one) {
              local_88 = cuddUniqueInter((DdManager *)f_local,markT,local_88,one);
            }
            t = local_88;
            if (local_88 == (DdNode *)0x0) {
              Cudd_IterDerefBdd((DdManager *)f_local,one);
              Cudd_IterDerefBdd((DdManager *)f_local,e);
              return (DdNode *)0x0;
            }
            t = (DdNode *)((ulong)local_88 ^ 1);
          }
        }
        else {
          t = e;
        }
        *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
        *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + -1;
        iVar1 = st__insert(table_local,(char *)cache_local,(char *)t);
        if (iVar1 == -10000) {
          *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) + 1;
          Cudd_IterDerefBdd((DdManager *)f_local,t);
          dd_local = (DdManager *)0x0;
        }
        else {
          dd_local = (DdManager *)((ulong)t ^ (long)markE);
        }
      }
    }
    else {
      dd_local = (DdManager *)((ulong)t ^ (long)markE);
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddBddLICBuildResult(
  DdManager * dd,
  DdNode * f,
  st__table * cache,
  st__table * table)
{
    DdNode *Fv, *Fnv, *r, *t, *e;
    DdNode *one, *zero;
    int index;
    int comple;
    int markT, markE, markings;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    if (Cudd_IsConstant(f)) return(f);
    /* Make canonical to increase the utilization of the cache. */
    comple = Cudd_IsComplement(f);
    f = Cudd_Regular(f);

    /* Check the cache. */
    if ( st__lookup(cache, (const char *)f, (char **)&r)) {
        return(Cudd_NotCond(r,comple));
    }

    /* Retrieve the edge markings. */
    if ( st__lookup_int(table, (char *)f, &markings) == 0)
        return(NULL);
    markT = markings >> 2;
    markE = markings & 3;

    index = f->index;
    Fv = cuddT(f); Fnv = cuddE(f);

    if (markT == DD_LIC_NL) {
        t = cuddBddLICBuildResult(dd,Fv,cache,table);
        if (t == NULL) {
            return(NULL);
        }
    } else if (markT == DD_LIC_1) {
        t = one;
    } else {
        t = zero;
    }
    cuddRef(t);
    if (markE == DD_LIC_NL) {
        e = cuddBddLICBuildResult(dd,Fnv,cache,table);
        if (e == NULL) {
            Cudd_IterDerefBdd(dd,t);
            return(NULL);
        }
    } else if (markE == DD_LIC_1) {
        e = one;
    } else {
        e = zero;
    }
    cuddRef(e);

    if (markT == DD_LIC_DC && markE != DD_LIC_DC) {
        r = e;
    } else if (markT != DD_LIC_DC && markE == DD_LIC_DC) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            t = Cudd_Not(t);
            e = Cudd_Not(e);
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if ( st__insert(cache, (char *)f, (char *)r) == st__OUT_OF_MEM) {
        cuddRef(r);
        Cudd_IterDerefBdd(dd,r);
        return(NULL);
    }

    return(Cudd_NotCond(r,comple));

}